

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::escaped(spec *s)

{
  initializer_list<unsigned_char> cs;
  long in_RSI;
  character_either *in_RDI;
  either escape_seq;
  character_either escape_char;
  sequence *in_stack_fffffffffffffdf8;
  hexdig *in_stack_fffffffffffffe00;
  hexdig *other;
  character_either *this;
  character_either *in_stack_fffffffffffffe28;
  either *in_stack_fffffffffffffe30;
  spec *in_stack_fffffffffffffe58;
  hexdig *in_stack_fffffffffffffe60;
  hexdig local_e8 [4];
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 *local_40;
  undefined8 local_38;
  long local_10;
  
  local_47 = 0x22;
  local_46 = 0x5c;
  local_45 = 0x62;
  local_44 = 0x66;
  local_43 = 0x6e;
  local_42 = 0x72;
  local_41 = 0x74;
  local_40 = &local_47;
  local_38 = 7;
  cs._M_len = (size_type)in_stack_fffffffffffffe30;
  cs._M_array = (iterator)in_stack_fffffffffffffe28;
  this = in_RDI;
  local_10 = in_RSI;
  character_either::character_either(in_RDI,cs);
  if ((*(byte *)(local_10 + 0x10) & 1) != 0) {
    character_either::push_back
              ((character_either *)in_stack_fffffffffffffe00,
               (char_type)((ulong)in_stack_fffffffffffffdf8 >> 0x38));
  }
  character::character
            ((character *)in_stack_fffffffffffffe00,
             (char_type)((ulong)in_stack_fffffffffffffdf8 >> 0x38));
  other = local_e8;
  hexdig::hexdig(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
            ((repeat_exact *)this,(size_t)in_RDI,other);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            ((sequence *)this,(character *)in_RDI,(repeat_exact *)other);
  character::character
            ((character *)in_stack_fffffffffffffe00,
             (char_type)((ulong)in_stack_fffffffffffffdf8 >> 0x38));
  hexdig::hexdig(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
            ((repeat_exact *)this,(size_t)in_RDI,other);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            ((sequence *)this,(character *)in_RDI,(repeat_exact *)other);
  either::either<toml::detail::character_either,toml::detail::sequence,toml::detail::sequence>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(sequence *)this,(sequence *)in_RDI
            );
  sequence::~sequence((sequence *)in_stack_fffffffffffffe00);
  repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffe00);
  hexdig::~hexdig(in_stack_fffffffffffffe00);
  character::~character((character *)0x6624d5);
  sequence::~sequence((sequence *)in_stack_fffffffffffffe00);
  repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffe00);
  hexdig::~hexdig(in_stack_fffffffffffffe00);
  character::~character((character *)0x662509);
  if ((*(byte *)(local_10 + 0x11) & 1) != 0) {
    character::character
              ((character *)in_stack_fffffffffffffe00,
               (char_type)((ulong)in_stack_fffffffffffffdf8 >> 0x38));
    in_stack_fffffffffffffe00 = (hexdig *)&stack0xfffffffffffffe38;
    hexdig::hexdig(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    repeat_exact::repeat_exact<toml::detail::syntax::hexdig>
              ((repeat_exact *)this,(size_t)in_RDI,other);
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
              ((sequence *)this,(character *)in_RDI,(repeat_exact *)other);
    either::push_back<toml::detail::sequence>
              ((either *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    sequence::~sequence((sequence *)in_stack_fffffffffffffe00);
    repeat_exact::~repeat_exact((repeat_exact *)in_stack_fffffffffffffe00);
    hexdig::~hexdig(in_stack_fffffffffffffe00);
    character::~character((character *)0x6625bb);
  }
  character::character
            ((character *)in_stack_fffffffffffffe00,
             (char_type)((ulong)&stack0xfffffffffffffe28 >> 0x38));
  sequence::sequence<toml::detail::character,toml::detail::either>
            ((sequence *)this,(character *)in_RDI,(either *)other);
  character::~character((character *)0x662744);
  either::~either((either *)in_stack_fffffffffffffe00);
  character_either::~character_either((character_either *)in_stack_fffffffffffffe00);
  return (sequence *)this;
}

Assistant:

TOML11_INLINE sequence escaped(const spec& s)
{
    character_either escape_char{
        '\"','\\', 'b', 'f', 'n', 'r', 't'
    };
    if(s.v1_1_0_add_escape_sequence_e)
    {
        escape_char.push_back(char_type('e'));
    }

    either escape_seq(
            std::move(escape_char),
            sequence(character('u'), repeat_exact(4, hexdig(s))),
            sequence(character('U'), repeat_exact(8, hexdig(s)))
        );

    if(s.v1_1_0_add_escape_sequence_x)
    {
        escape_seq.push_back(
            sequence(character('x'), repeat_exact(2, hexdig(s)))
        );
    }

    return sequence(
            character('\\'),
            std::move(escape_seq)
        );
}